

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O0

bool sensors_analytics::Sdk::AssertKey(string *type,string *key)

{
  char cVar1;
  ulong uVar2;
  ostream *poVar3;
  char *pcVar4;
  ulong local_38;
  size_t i;
  char ch;
  size_t len;
  string *key_local;
  string *type_local;
  
  uVar2 = std::__cxx11::string::length();
  if ((uVar2 == 0) || (100 < uVar2)) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"The ");
    poVar3 = std::operator<<(poVar3,(string *)type);
    std::operator<<(poVar3," is empty or too long, max length is 100");
    type_local._7_1_ = false;
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)key);
    cVar1 = *pcVar4;
    if ((((cVar1 < 'a') || ('z' < cVar1)) && (cVar1 != '$')) &&
       (((cVar1 < 'A' || ('Z' < cVar1)) && (cVar1 != '_')))) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"The ");
      poVar3 = std::operator<<(poVar3,(string *)type);
      std::operator<<(poVar3," need to be a valid variable name.");
      type_local._7_1_ = false;
    }
    else {
      for (local_38 = 1; local_38 < uVar2; local_38 = local_38 + 1) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)key);
        cVar1 = *pcVar4;
        if ((((cVar1 < 'a') || ('z' < cVar1)) && ((cVar1 < '0' || ('9' < cVar1)))) &&
           ((((cVar1 < 'A' || ('Z' < cVar1)) && (cVar1 != '$')) && (cVar1 != '_')))) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"The ");
          poVar3 = std::operator<<(poVar3,(string *)type);
          std::operator<<(poVar3," need to be a valid variable name.");
          return false;
        }
      }
      type_local._7_1_ = true;
    }
  }
  return type_local._7_1_;
}

Assistant:

bool Sdk::AssertKey(const string &type, const string &key) {
  size_t len = key.length();
  if (len < 1 || len > 100) {
    std::cerr << "The " << type << " is empty or too long, max length is 100";
    return false;
  }
  char ch = key[0];
  if ((ch >= 'a' && ch <= 'z') || ch == '$' ||
      (ch >= 'A' && ch <= 'Z') || ch == '_') {
    for (size_t i = 1; i < len; ++i) {
      ch = key[i];
      if ((ch >= 'a' && ch <= 'z') || (ch >= '0' && ch <= '9') ||
          (ch >= 'A' && ch <= 'Z') || ch == '$' || ch == '_') {
        continue;
      }
      std::cerr << "The " << type << " need to be a valid variable name.";
      return false;
    }
    return true;
  } else {
    std::cerr << "The " << type << " need to be a valid variable name.";
    return false;
  }
}